

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

bool __thiscall
Inline::SplitConstructorCallCommon
          (Inline *this,Instr *newObjInstr,Opnd *lastArgOpnd,OpCode newObjOpCode,bool isInlined,
          bool isFixed,Instr **createObjInstrOut,Instr **callCtorInstrOut)

{
  TSize TVar1;
  Func *func;
  code *pcVar2;
  bool bVar3;
  ValueType valueType;
  undefined4 *puVar4;
  Opnd *pOVar5;
  ProfiledInstr *pPVar6;
  FixedFieldInfo *this_00;
  intptr_t iVar7;
  ThreadContextInfo *pTVar8;
  intptr_t iVar9;
  StackSym *sym;
  SymOpnd *dstOpnd;
  Instr *pIVar10;
  Instr *instr_00;
  Instr *pIVar11;
  Opnd *src1Opnd;
  bool local_c2;
  bool local_c1;
  Instr *nextByteCodeOffsetInstr;
  Instr *insertBeforeInstr;
  Instr *instr;
  SymOpnd *thisArgOpnd;
  Instr *local_70;
  Opnd *thisPtrOpnd;
  intptr_t ctorInfo;
  FixedFieldInfo *ctor;
  ProfileId profiledCallSiteId;
  bool skipNewScObj;
  JITTimeConstructorCache *pJStack_50;
  bool returnCreatedObject;
  JITTimeConstructorCache *constructorCache;
  Instr *createObjInstr;
  RegOpnd *createObjDst;
  Func *callerFunc;
  bool isFixed_local;
  bool isInlined_local;
  OpCode newObjOpCode_local;
  Opnd *lastArgOpnd_local;
  Instr *newObjInstr_local;
  Inline *this_local;
  
  if (newObjInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x1123,"(newObjInstr)","newObjInstr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pOVar5 = IR::Instr::GetSrc1(newObjInstr);
  if (pOVar5 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x1124,"(newObjInstr->GetSrc1())","newObjInstr->GetSrc1()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (lastArgOpnd == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x1125,"(lastArgOpnd)","lastArgOpnd");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((!isInlined) && (!isFixed)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x1126,"(isInlined || isFixed)","isInlined || isFixed");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  func = newObjInstr->m_func;
  createObjInstr = (Instr *)0x0;
  constructorCache = (JITTimeConstructorCache *)0x0;
  ctor._7_1_ = false;
  ctor._6_1_ = false;
  bVar3 = IR::Instr::IsProfiledInstr(newObjInstr);
  if (bVar3) {
    pPVar6 = IR::Instr::AsProfiledInstr(newObjInstr);
    TVar1 = (pPVar6->u).field_3.fldInfoData;
    pJStack_50 = Func::GetConstructorCache(newObjInstr->m_func,TVar1.f1);
    local_c1 = false;
    if (pJStack_50 != (JITTimeConstructorCache *)0x0) {
      local_c1 = JITTimeConstructorCache::CtorHasNoExplicitReturnValue(pJStack_50);
    }
    ctor._7_1_ = local_c1;
    local_c2 = false;
    if (pJStack_50 != (JITTimeConstructorCache *)0x0) {
      local_c2 = JITTimeConstructorCache::SkipNewScObject(pJStack_50);
    }
    ctor._6_1_ = local_c2;
    if (local_c2 == false) {
      createObjInstr = (Instr *)IR::RegOpnd::New(TyVar,func);
      pOVar5 = IR::Instr::GetSrc1(newObjInstr);
      constructorCache =
           (JITTimeConstructorCache *)
           IR::ProfiledInstr::New(newObjOpCode,(Opnd *)createObjInstr,pOVar5,func);
      pPVar6 = IR::Instr::AsProfiledInstr((Instr *)constructorCache);
      (pPVar6->u).profileId = (uint)TVar1 & 0xffff;
    }
  }
  else {
    pJStack_50 = (JITTimeConstructorCache *)0x0;
    createObjInstr = (Instr *)IR::RegOpnd::New(TyVar,func);
    pOVar5 = IR::Instr::GetSrc1(newObjInstr);
    constructorCache =
         (JITTimeConstructorCache *)IR::Instr::New(newObjOpCode,(Opnd *)createObjInstr,pOVar5,func);
  }
  if ((isInlined) && (ctor._6_1_ != false)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x1149,"(!isInlined || !skipNewScObj)","!isInlined || !skipNewScObj");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((!isFixed) && (ctor._6_1_ != false)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x114a,"(isFixed || !skipNewScObj)","isFixed || !skipNewScObj");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (ctor._6_1_ != false) {
    this_00 = IR::Instr::GetFixedFunction(newObjInstr);
    iVar7 = FixedFieldInfo::GetFuncInfoAddr(this_00);
    pTVar8 = Func::GetThreadContextInfo(this->topFunc);
    iVar9 = ThreadContextInfo::GetJavascriptObjectNewInstanceAddr(pTVar8);
    if (iVar7 != iVar9) {
      pTVar8 = Func::GetThreadContextInfo(this->topFunc);
      iVar9 = ThreadContextInfo::GetJavascriptArrayNewInstanceAddr(pTVar8);
      if (iVar7 != iVar9) goto LAB_00723b39;
    }
    bVar3 = IR::Instr::HasEmptyArgOutChain(newObjInstr,(Instr **)0x0);
    if (bVar3) {
      return false;
    }
  }
LAB_00723b39:
  if (constructorCache == (JITTimeConstructorCache *)0x0) {
    local_70 = (Instr *)IR::AddrOpnd::NewNull(newObjInstr->m_func);
  }
  else {
    IR::Instr::SetByteCodeOffset((Instr *)constructorCache,newObjInstr);
    pOVar5 = IR::Instr::GetSrc1((Instr *)constructorCache);
    IR::Opnd::SetIsJITOptimizedReg(pOVar5,true);
    *(ushort *)((long)&(constructorCache->m_data).type.propertyCacheAddr.ptr + 6) =
         *(ushort *)((long)&(constructorCache->m_data).type.propertyCacheAddr.ptr + 6) & 0xfdff |
         0x200;
    IR::Instr::InsertBefore(newObjInstr,(Instr *)constructorCache);
    valueType = ValueType::GetObject(UninitializedObject);
    IR::Opnd::SetValueType((Opnd *)createObjInstr,valueType);
    local_70 = createObjInstr;
  }
  sym = SymTable::GetArgSlotSym(func->m_symTable,1);
  dstOpnd = IR::SymOpnd::New(&sym->super_Sym,TyVar,func);
  pIVar10 = IR::Instr::New(ArgOut_A,&dstOpnd->super_Opnd,(Opnd *)local_70,lastArgOpnd,func);
  IR::Instr::SetByteCodeOffset(pIVar10,newObjInstr);
  pOVar5 = IR::Instr::GetDst(pIVar10);
  IR::Opnd::SetIsJITOptimizedReg(pOVar5,true);
  pOVar5 = IR::Instr::GetSrc2(pIVar10);
  IR::Opnd::SetIsJITOptimizedReg(pOVar5,true);
  IR::Instr::InsertBefore(newObjInstr,pIVar10);
  if (isFixed) {
    newObjInstr->m_opcode = CallIFixed;
  }
  else {
    newObjInstr->m_opcode = CallI;
  }
  *(ushort *)&newObjInstr->field_0x36 = *(ushort *)&newObjInstr->field_0x36 & 0xdfff | 0x2000;
  pOVar5 = IR::Instr::GetSrc2(newObjInstr);
  if (pOVar5 != (Opnd *)0x0) {
    IR::Instr::FreeSrc2(newObjInstr);
  }
  IR::Instr::SetSrc2(newObjInstr,&dstOpnd->super_Opnd);
  pIVar10 = newObjInstr->m_next;
  if (pIVar10 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x1188,"(insertBeforeInstr)","insertBeforeInstr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  instr_00 = IR::Instr::GetNextRealInstrOrLabel(newObjInstr);
  if (ctor._7_1_ == false) {
    if (ctor._6_1_ == false) {
      pIVar11 = (Instr *)IR::Instr::GetDst(newObjInstr);
      if (createObjInstr == pIVar11) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x1198,"(createObjDst != newObjInstr->GetDst())",
                           "createObjDst != newObjInstr->GetDst()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      pOVar5 = IR::Instr::GetDst(newObjInstr);
      IR::Opnd::SetValueType(pOVar5,ValueType::Uninitialized);
      pOVar5 = IR::Instr::GetDst(newObjInstr);
      src1Opnd = IR::Instr::GetDst(newObjInstr);
      pIVar11 = IR::Instr::New(GetNewScObject,pOVar5,src1Opnd,(Opnd *)createObjInstr,func);
      IR::Instr::SetByteCodeOffset(pIVar11,instr_00);
      pOVar5 = IR::Instr::GetDst(pIVar11);
      IR::Opnd::SetIsJITOptimizedReg(pOVar5,true);
      pOVar5 = IR::Instr::GetSrc1(pIVar11);
      IR::Opnd::SetIsJITOptimizedReg(pOVar5,true);
      IR::Instr::InsertBefore(pIVar10,pIVar11);
    }
  }
  else {
    pOVar5 = IR::Instr::GetDst(newObjInstr);
    pIVar11 = IR::Instr::New(Ld_A,pOVar5,(Opnd *)createObjInstr,func);
    IR::Instr::SetByteCodeOffset(pIVar11,instr_00);
    pOVar5 = IR::Instr::GetDst(pIVar11);
    IR::Opnd::SetIsJITOptimizedReg(pOVar5,true);
    pOVar5 = IR::Instr::GetSrc1(pIVar11);
    IR::Opnd::SetIsJITOptimizedReg(pOVar5,true);
    IR::Instr::InsertBefore(pIVar10,pIVar11);
  }
  if (pJStack_50 == (JITTimeConstructorCache *)0x0) {
    pIVar11 = IR::Instr::New(UpdateNewScObjectCache,func);
    pOVar5 = IR::Instr::GetSrc1(newObjInstr);
    IR::Instr::SetSrc1(pIVar11,pOVar5);
    pOVar5 = IR::Instr::GetDst(newObjInstr);
    IR::Instr::SetSrc2(pIVar11,pOVar5);
    IR::Instr::SetByteCodeOffset(pIVar11,instr_00);
    pOVar5 = IR::Instr::GetSrc1(pIVar11);
    IR::Opnd::SetIsJITOptimizedReg(pOVar5,true);
    pOVar5 = IR::Instr::GetSrc2(pIVar11);
    IR::Opnd::SetIsJITOptimizedReg(pOVar5,true);
    IR::Instr::InsertBefore(pIVar10,pIVar11);
  }
  if (createObjInstrOut != (Instr **)0x0) {
    *createObjInstrOut = (Instr *)constructorCache;
  }
  if (callCtorInstrOut != (Instr **)0x0) {
    *callCtorInstrOut = newObjInstr;
  }
  return true;
}

Assistant:

bool
Inline::SplitConstructorCallCommon(
    IR::Instr *const newObjInstr,
    IR::Opnd *const lastArgOpnd,
    const Js::OpCode newObjOpCode,
    const bool isInlined,
    const bool isFixed,
    IR::Instr** createObjInstrOut,
    IR::Instr** callCtorInstrOut) const
{
    Assert(newObjInstr);
    Assert(newObjInstr->GetSrc1());
    Assert(lastArgOpnd);
    Assert(isInlined || isFixed);

    const auto callerFunc = newObjInstr->m_func;

    // Call the NoCtor version of NewScObject

    // Use a temporary register for the newly allocated object (before the call to ctor) - even if we know we'll return this
    // object from the whole operation.  That's so that we don't trash the bytecode register if we need to bail out at
    // object allocation (bytecode instruction has the form [Profiled]NewScObject R6 = R6).
    IR::RegOpnd* createObjDst = nullptr;
    IR::Instr* createObjInstr = nullptr;
    const JITTimeConstructorCache* constructorCache;
    bool returnCreatedObject = false;
    bool skipNewScObj = false;

    if (newObjInstr->IsProfiledInstr())
    {
        Js::ProfileId profiledCallSiteId = static_cast<Js::ProfileId>(newObjInstr->AsProfiledInstr()->u.profileId);
        constructorCache = newObjInstr->m_func->GetConstructorCache(profiledCallSiteId);
        returnCreatedObject = constructorCache != nullptr && constructorCache->CtorHasNoExplicitReturnValue();
        skipNewScObj = constructorCache != nullptr && constructorCache->SkipNewScObject();
        if (!skipNewScObj)
        {
            createObjDst = IR::RegOpnd::New(TyVar, callerFunc);
            createObjInstr = IR::ProfiledInstr::New(newObjOpCode, createObjDst, newObjInstr->GetSrc1(), callerFunc);
            createObjInstr->AsProfiledInstr()->u.profileId = profiledCallSiteId;
        }
    }
    else
    {
        constructorCache = nullptr;
        createObjDst = IR::RegOpnd::New(TyVar, callerFunc);
        createObjInstr = IR::Instr::New(newObjOpCode, createObjDst, newObjInstr->GetSrc1(), callerFunc);
    }

    Assert(!isInlined || !skipNewScObj);
    Assert(isFixed || !skipNewScObj);

    // For new Object() and new Array() we have special fast helpers.  We'll let the lowerer convert this instruction directly
    // into a call to one of these helpers.
    if (skipNewScObj)
    {
        FixedFieldInfo* ctor = newObjInstr->GetFixedFunction();
        intptr_t ctorInfo = ctor->GetFuncInfoAddr();
        if ((ctorInfo == topFunc->GetThreadContextInfo()->GetJavascriptObjectNewInstanceAddr() ||
            ctorInfo == topFunc->GetThreadContextInfo()->GetJavascriptArrayNewInstanceAddr()) &&
            newObjInstr->HasEmptyArgOutChain())
        {
            return false;
        }
    }

    IR::Opnd* thisPtrOpnd;
    if (createObjInstr != nullptr)
    {
        createObjInstr->SetByteCodeOffset(newObjInstr);
        createObjInstr->GetSrc1()->SetIsJITOptimizedReg(true);
        // We're splitting a single byte code, so the interpreter has to resume from the beginning if we bail out.
        createObjInstr->forcePreOpBailOutIfNeeded = true;
        newObjInstr->InsertBefore(createObjInstr);

        createObjDst->SetValueType(ValueType::GetObject(ObjectType::UninitializedObject));
        thisPtrOpnd = createObjDst;
    }
    else
    {
        thisPtrOpnd = IR::AddrOpnd::NewNull(newObjInstr->m_func);
    }

    // Pass the new object to the constructor function with an ArgOut
    const auto thisArgOpnd = IR::SymOpnd::New(callerFunc->m_symTable->GetArgSlotSym(1), TyVar, callerFunc);
    auto instr = IR::Instr::New(Js::OpCode::ArgOut_A, thisArgOpnd, thisPtrOpnd, lastArgOpnd, callerFunc);
    instr->SetByteCodeOffset(newObjInstr);
    instr->GetDst()->SetIsJITOptimizedReg(true);
    instr->GetSrc2()->SetIsJITOptimizedReg(true);
    newObjInstr->InsertBefore(instr);

    // Call the constructor using CallI with isCtorCall set.  If we inline the constructor, and the inlined constructor
    // bails out, the interpreter would be entered with CallFlags_Value as well. If the interpreter starts using the
    // call flags, the proper call flags will need to be specified here by using a different op code specific to constructors.
    if (isFixed)
    {
        newObjInstr->m_opcode = Js::OpCode::CallIFixed;
    }
    else
    {
        newObjInstr->m_opcode = Js::OpCode::CallI;
    }

    newObjInstr->isCtorCall = true;

    if(newObjInstr->GetSrc2())
    {
        newObjInstr->FreeSrc2();
    }
    newObjInstr->SetSrc2(thisArgOpnd);

    const auto insertBeforeInstr = newObjInstr->m_next;
    Assert(insertBeforeInstr);
    const auto nextByteCodeOffsetInstr = newObjInstr->GetNextRealInstrOrLabel();

    // Determine which object to use as the final result of NewScObject, the object passed into the constructor as 'this', or
    // the object returned by the constructor.  We only need this if we don't have a hard-coded constructor cache, or if the
    // constructor returns something explicitly.  Otherwise, we simply return the object we allocated and passed to the constructor.
    if (returnCreatedObject)
    {
        instr = IR::Instr::New(Js::OpCode::Ld_A, newObjInstr->GetDst(), createObjDst, callerFunc);
        instr->SetByteCodeOffset(nextByteCodeOffsetInstr);
        instr->GetDst()->SetIsJITOptimizedReg(true);
        instr->GetSrc1()->SetIsJITOptimizedReg(true);
        insertBeforeInstr->InsertBefore(instr);
    }
    else if (!skipNewScObj)
    {
        Assert(createObjDst != newObjInstr->GetDst());

        // Since we're not returning the default new object, the constructor must be returning something explicitly.  We don't
        // know at this point whether it's an object or not.  If the constructor is later inlined, the value type will be determined
        // from the flow in glob opt.  Otherwise, we'll need to emit an object check.
        newObjInstr->GetDst()->SetValueType(ValueType::Uninitialized);

        instr = IR::Instr::New(Js::OpCode::GetNewScObject, newObjInstr->GetDst(), newObjInstr->GetDst(), createObjDst, callerFunc);
        instr->SetByteCodeOffset(nextByteCodeOffsetInstr);
        instr->GetDst()->SetIsJITOptimizedReg(true);
        instr->GetSrc1()->SetIsJITOptimizedReg(true);
        insertBeforeInstr->InsertBefore(instr);
    }

    // Update the NewScObject cache, but only if we don't have a hard-coded constructor cache.  We only clone caches that
    // don't require update, and once updated a cache never requires an update again.
    if (constructorCache == nullptr)
    {
        instr = IR::Instr::New(Js::OpCode::UpdateNewScObjectCache, callerFunc);
        instr->SetSrc1(newObjInstr->GetSrc1()); // constructor function
        instr->SetSrc2(newObjInstr->GetDst());  // the new object
        instr->SetByteCodeOffset(nextByteCodeOffsetInstr);
        instr->GetSrc1()->SetIsJITOptimizedReg(true);
        instr->GetSrc2()->SetIsJITOptimizedReg(true);
        insertBeforeInstr->InsertBefore(instr);
    }

    if (createObjInstrOut != nullptr)
    {
        *createObjInstrOut = createObjInstr;
    }

    if (callCtorInstrOut != nullptr)
    {
        *callCtorInstrOut = newObjInstr;
    }

    return true;
}